

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtGjkEpa2.cpp
# Opt level: O2

bool cbtGjkEpaSolver2::Penetration
               (cbtConvexShape *shape0,cbtTransform *wtrs0,cbtConvexShape *shape1,
               cbtTransform *wtrs1,cbtVector3 *guess,sResults *results,bool usemargins)

{
  float fVar1;
  undefined8 uVar2;
  float fVar3;
  _ _Var4;
  _ _Var5;
  code *pcVar6;
  long *plVar7;
  U i;
  ulong uVar8;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar16 [56];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  cbtScalar acVar9 [4];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  cbtVector3 cVar25;
  cbtVector3 cVar26;
  undefined1 auVar27 [12];
  tShape shape;
  GJK gjk;
  EPA epa;
  cbtVector3 local_7338;
  cbtScalar local_7328 [4];
  cbtVector3 local_7318;
  tShape local_7308;
  GJK local_7278;
  EPA local_70a8;
  undefined1 auVar23 [56];
  
  auVar23 = in_ZMM1._8_56_;
  gjkepa2_impl::Initialize(shape0,wtrs0,shape1,wtrs1,results,&local_7308,usemargins);
  auVar16 = ZEXT856(0);
  local_7278.m_nfree = 0;
  local_7278.m_current = 0;
  local_7278.m_ray.m_floats[0] = 0.0;
  local_7278.m_ray.m_floats[1] = 0.0;
  local_7278.m_ray.m_floats[2] = 0.0;
  local_7278.m_ray.m_floats[3] = 0.0;
  local_7278.m_status = Failed;
  local_7278.m_distance = 0.0;
  cVar25 = ::operator-(guess);
  auVar19._0_8_ = cVar25.m_floats._8_8_;
  auVar19._8_56_ = auVar23;
  auVar12._0_8_ = cVar25.m_floats._0_8_;
  auVar12._8_56_ = auVar16;
  local_70a8._0_16_ = vmovlhps_avx(auVar12._0_16_,auVar19._0_16_);
  auVar16 = ZEXT856(local_70a8.m_result.c[0]);
  _Var4 = gjkepa2_impl::GJK::Evaluate(&local_7278,&local_7308,(cbtVector3 *)&local_70a8);
  if (_Var4 == Failed) {
    results->status = GJK_Failed;
  }
  else if (_Var4 == Inside) {
    gjkepa2_impl::EPA::EPA(&local_70a8);
    cVar25 = ::operator-(guess);
    auVar20._0_8_ = cVar25.m_floats._8_8_;
    auVar20._8_56_ = auVar23;
    auVar13._0_8_ = cVar25.m_floats._0_8_;
    auVar13._8_56_ = auVar16;
    local_7338.m_floats = (cbtScalar  [4])vmovlhps_avx(auVar13._0_16_,auVar20._0_16_);
    _Var5 = gjkepa2_impl::EPA::Evaluate(&local_70a8,&local_7278,&local_7338);
    if (_Var5 != Failed) {
      acVar9 = (cbtScalar  [4])(ZEXT816(0) << 0x40);
      auVar17 = ZEXT816(0) << 0x40;
      uVar8 = 0;
      local_7338.m_floats = acVar9;
      while( true ) {
        auVar23 = ZEXT856(auVar17._8_8_);
        auVar16 = ZEXT856(acVar9._8_8_);
        if (local_70a8.m_result.rank <= uVar8) break;
        plVar7 = (long *)((long)&(local_7308.m_shapes[0]->super_cbtCollisionShape).
                                 _vptr_cbtCollisionShape + local_7308._136_8_);
        pcVar6 = (code *)local_7308.Ls;
        if ((local_7308.Ls & 1) != 0) {
          pcVar6 = *(code **)(local_7308.Ls + *plVar7 + -1);
        }
        local_7328 = acVar9;
        auVar27 = (*pcVar6)(plVar7,*(undefined8 *)
                                    ((long)*(undefined1 (*) [16])&local_70a8 + uVar8 * 8 + 8));
        fVar1 = *(float *)((long)((undefined1 (*) [16])&local_70a8 + 2) + 8U + uVar8 * 4);
        uVar8 = uVar8 + 1;
        fVar3 = fVar1 * auVar27._8_4_ + auVar17._0_4_;
        acVar9[0] = local_7328[0] + fVar1 * auVar27._0_4_;
        acVar9[1] = local_7328[1] + fVar1 * auVar27._4_4_;
        acVar9[2] = local_7328[2] + fVar1 * (float)extraout_XMM0_Qb;
        acVar9[3] = local_7328[3] + fVar1 * (float)((ulong)extraout_XMM0_Qb >> 0x20);
        uVar2 = vmovlps_avx((undefined1  [16])acVar9);
        local_7338.m_floats[2] = fVar3;
        local_7338.m_floats[0] = (cbtScalar)(int)uVar2;
        local_7338.m_floats[1] = (cbtScalar)(int)((ulong)uVar2 >> 0x20);
        auVar17 = ZEXT416((uint)fVar3);
      }
      results->status = Penetrating;
      cVar26 = cbtTransform::operator()(wtrs0,&local_7338);
      cVar25.m_floats = local_7338.m_floats;
      auVar21._0_8_ = cVar26.m_floats._8_8_;
      auVar21._8_56_ = auVar23;
      auVar14._0_8_ = cVar26.m_floats._0_8_;
      auVar14._8_56_ = auVar16;
      auVar17 = vmovlhps_avx(auVar14._0_16_,auVar21._0_16_);
      *(undefined1 (*) [16])results->witnesses[0].m_floats = auVar17;
      auVar17._4_4_ = local_70a8.m_normal.m_floats[1];
      auVar17._0_4_ = local_70a8.m_normal.m_floats[0];
      auVar17._8_4_ = local_70a8.m_normal.m_floats[2];
      auVar17._12_4_ = local_70a8.m_normal.m_floats[3];
      auVar17 = vinsertps_avx(auVar17,ZEXT416((uint)local_70a8.m_depth),0x10);
      auVar11 = vinsertps_avx(ZEXT416((uint)local_70a8.m_depth),
                              ZEXT416((uint)local_70a8.m_normal.m_floats[1]),0x10);
      auVar10._0_4_ = auVar17._0_4_ * auVar11._0_4_;
      auVar10._4_4_ = auVar17._4_4_ * auVar11._4_4_;
      auVar10._8_4_ = auVar17._8_4_ * auVar11._8_4_;
      auVar10._12_4_ = auVar17._12_4_ * auVar11._12_4_;
      auVar18._8_8_ = 0;
      auVar18._0_4_ = local_7338.m_floats[0];
      auVar18._4_4_ = local_7338.m_floats[1];
      auVar17 = vsubps_avx(auVar18,auVar10);
      local_7338.m_floats[2] = cVar25.m_floats[2];
      auVar23 = (undefined1  [56])0x0;
      local_7318.m_floats =
           (cbtScalar  [4])
           vinsertps_avx(auVar17,ZEXT416((uint)(local_7338.m_floats[2] -
                                               local_70a8.m_depth * local_70a8.m_normal.m_floats[2])
                                        ),0x28);
      auVar16 = ZEXT856(local_7318.m_floats._8_8_);
      local_7338.m_floats = cVar25.m_floats;
      cVar25 = cbtTransform::operator()(wtrs0,&local_7318);
      auVar22._0_8_ = cVar25.m_floats._8_8_;
      auVar22._8_56_ = auVar23;
      auVar15._0_8_ = cVar25.m_floats._0_8_;
      auVar15._8_56_ = auVar16;
      auVar17 = vmovlhps_avx(auVar15._0_16_,auVar22._0_16_);
      *(undefined1 (*) [16])results->witnesses[1].m_floats = auVar17;
      auVar11._0_8_ =
           CONCAT44(local_70a8.m_normal.m_floats[1],local_70a8.m_normal.m_floats[0]) ^
           0x8000000080000000;
      auVar11._8_4_ = 0x80000000;
      auVar11._12_4_ = 0x80000000;
      auVar24._0_4_ = -local_70a8.m_normal.m_floats[2];
      auVar24._4_4_ = 0x80000000;
      auVar24._8_4_ = 0x80000000;
      auVar24._12_4_ = 0x80000000;
      auVar17 = vinsertps_avx(auVar11,auVar24,0x28);
      *(undefined1 (*) [16])(results->normal).m_floats = auVar17;
      results->distance = -local_70a8.m_depth;
      return true;
    }
    results->status = EPA_Failed;
  }
  return false;
}

Assistant:

bool cbtGjkEpaSolver2::Penetration(const cbtConvexShape* shape0,
								  const cbtTransform& wtrs0,
								  const cbtConvexShape* shape1,
								  const cbtTransform& wtrs1,
								  const cbtVector3& guess,
								  sResults& results,
								  bool usemargins)
{
	tShape shape;
	Initialize(shape0, wtrs0, shape1, wtrs1, results, shape, usemargins);
	GJK gjk;
	GJK::eStatus::_ gjk_status = gjk.Evaluate(shape, -guess);
	switch (gjk_status)
	{
		case GJK::eStatus::Inside:
		{
			EPA epa;
			EPA::eStatus::_ epa_status = epa.Evaluate(gjk, -guess);
			if (epa_status != EPA::eStatus::Failed)
			{
				cbtVector3 w0 = cbtVector3(0, 0, 0);
				for (U i = 0; i < epa.m_result.rank; ++i)
				{
					w0 += shape.Support(epa.m_result.c[i]->d, 0) * epa.m_result.p[i];
				}
				results.status = sResults::Penetrating;
				results.witnesses[0] = wtrs0 * w0;
				results.witnesses[1] = wtrs0 * (w0 - epa.m_normal * epa.m_depth);
				results.normal = -epa.m_normal;
				results.distance = -epa.m_depth;
				return (true);
			}
			else
				results.status = sResults::EPA_Failed;
		}
		break;
		case GJK::eStatus::Failed:
			results.status = sResults::GJK_Failed;
			break;
		default:
		{
		}
	}
	return (false);
}